

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_disk_posix.c
# Opt level: O1

ssize_t write_data_block(archive_write_disk *a,char *buff,size_t size)

{
  long lVar1;
  wchar_t wVar2;
  size_t sVar3;
  long lVar4;
  __off_t _Var5;
  ssize_t sVar6;
  int *piVar7;
  long lVar8;
  uint64_t start_size;
  size_t sVar9;
  size_t sVar10;
  int error_number;
  size_t unaff_R12;
  char *pcVar11;
  long local_38;
  
  if (size == 0) {
    return 0;
  }
  if ((a->filesize == 0) || (a->fd < L'\0')) {
    pcVar11 = "Attempt to write to an empty file";
    error_number = 0;
LAB_0051618c:
    archive_set_error(&a->archive,error_number,pcVar11);
    sVar3 = 0xffffffffffffffec;
  }
  else {
    if ((a->flags & L'က') == L'\0') {
      local_38 = 0;
    }
    else {
      wVar2 = lazy_stat(a);
      if (wVar2 != L'\0') {
        return (long)wVar2;
      }
      local_38 = a->pst->st_blksize;
    }
    lVar8 = a->filesize;
    sVar3 = size;
    if ((-1 < lVar8) && (sVar9 = lVar8 - a->offset, lVar8 < (long)(a->offset + size))) {
      size = sVar9;
      sVar3 = sVar9;
    }
    for (; size != 0; size = size - sVar6) {
      sVar9 = size;
      if (local_38 != 0) {
        pcVar11 = buff;
        if (0 < (long)size) {
          do {
            if (*pcVar11 != '\0') break;
            pcVar11 = pcVar11 + 1;
          } while (pcVar11 < buff + size);
        }
        lVar1 = a->offset;
        lVar8 = lVar1 + ((long)pcVar11 - (long)buff);
        a->offset = lVar8;
        sVar10 = size - ((long)pcVar11 - (long)buff);
        if ((sVar10 != 0) &&
           (lVar4 = (lVar8 / local_38 + 1) * local_38, unaff_R12 = lVar4 - lVar8,
           (long)(lVar1 + size) <= lVar4)) {
          unaff_R12 = sVar10;
        }
        size = sVar10;
        sVar9 = unaff_R12;
        buff = pcVar11;
        if (sVar10 == 0) {
          return sVar3;
        }
      }
      if (a->offset != a->fd_offset) {
        _Var5 = lseek(a->fd,a->offset,0);
        if (_Var5 < 0) {
          piVar7 = __errno_location();
          archive_set_error(&a->archive,*piVar7,"Seek failed");
          return -0x1e;
        }
        a->fd_offset = a->offset;
      }
      sVar6 = write(a->fd,buff,sVar9);
      if (sVar6 < 0) {
        piVar7 = __errno_location();
        error_number = *piVar7;
        pcVar11 = "Write failed";
        goto LAB_0051618c;
      }
      a->total_bytes_written = a->total_bytes_written + sVar6;
      buff = buff + sVar6;
      lVar8 = a->offset + sVar6;
      a->offset = lVar8;
      a->fd_offset = lVar8;
      unaff_R12 = sVar9;
    }
  }
  return sVar3;
}

Assistant:

static ssize_t
write_data_block(struct archive_write_disk *a, const char *buff, size_t size)
{
	uint64_t start_size = size;
	ssize_t bytes_written = 0;
	ssize_t block_size = 0, bytes_to_write;

	if (size == 0)
		return (ARCHIVE_OK);

	if (a->filesize == 0 || a->fd < 0) {
		archive_set_error(&a->archive, 0,
		    "Attempt to write to an empty file");
		return (ARCHIVE_WARN);
	}

	if (a->flags & ARCHIVE_EXTRACT_SPARSE) {
#if HAVE_STRUCT_STAT_ST_BLKSIZE
		int r;
		if ((r = lazy_stat(a)) != ARCHIVE_OK)
			return (r);
		block_size = a->pst->st_blksize;
#else
		/* XXX TODO XXX Is there a more appropriate choice here ? */
		/* This needn't match the filesystem allocation size. */
		block_size = 16*1024;
#endif
	}

	/* If this write would run beyond the file size, truncate it. */
	if (a->filesize >= 0 && (int64_t)(a->offset + size) > a->filesize)
		start_size = size = (size_t)(a->filesize - a->offset);

	/* Write the data. */
	while (size > 0) {
		if (block_size == 0) {
			bytes_to_write = size;
		} else {
			/* We're sparsifying the file. */
			const char *p, *end;
			int64_t block_end;

			/* Skip leading zero bytes. */
			for (p = buff, end = buff + size; p < end; ++p) {
				if (*p != '\0')
					break;
			}
			a->offset += p - buff;
			size -= p - buff;
			buff = p;
			if (size == 0)
				break;

			/* Calculate next block boundary after offset. */
			block_end
			    = (a->offset / block_size + 1) * block_size;

			/* If the adjusted write would cross block boundary,
			 * truncate it to the block boundary. */
			bytes_to_write = size;
			if (a->offset + bytes_to_write > block_end)
				bytes_to_write = block_end - a->offset;
		}
		/* Seek if necessary to the specified offset. */
		if (a->offset != a->fd_offset) {
			if (lseek(a->fd, a->offset, SEEK_SET) < 0) {
				archive_set_error(&a->archive, errno,
				    "Seek failed");
				return (ARCHIVE_FATAL);
			}
			a->fd_offset = a->offset;
		}
		bytes_written = write(a->fd, buff, bytes_to_write);
		if (bytes_written < 0) {
			archive_set_error(&a->archive, errno, "Write failed");
			return (ARCHIVE_WARN);
		}
		buff += bytes_written;
		size -= bytes_written;
		a->total_bytes_written += bytes_written;
		a->offset += bytes_written;
		a->fd_offset = a->offset;
	}
	return (start_size - size);
}